

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int64 __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  byte *pbVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  pair<unsigned_long,_bool> pVar7;
  LogFinisher local_59;
  LogMessage local_58;
  
  pbVar6 = this->buffer_;
  pbVar1 = this->buffer_end_;
  if (((int)pbVar1 - (int)pbVar6 < 10) && ((pbVar1 <= pbVar6 || ((char)pbVar1[-1] < '\0')))) {
    pVar7 = ReadVarint64Fallback(this);
    uVar3 = 0xffffffffffffffff;
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = (ulong)(uint)pVar7.first;
    }
  }
  else {
    if (first_byte_or_zero == 0) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1a7);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (first_byte_or_zero) != (0): ");
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,"Caller should provide us with *buffer_ when buffer is non-empty");
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
      pbVar6 = this->buffer_;
    }
    if (*pbVar6 != first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x14f);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (*buffer) == (first_byte): ");
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
    }
    if (-1 < (char)first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x150);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (first_byte & 0x80) == (0x80): ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,first_byte_or_zero);
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
    }
    uVar4 = ((uint)pbVar6[1] * 0x80 + first_byte_or_zero) - 0x80;
    if ((char)pbVar6[1] < '\0') {
      uVar4 = (uVar4 + (uint)pbVar6[2] * 0x4000) - 0x4000;
      if ((char)pbVar6[2] < '\0') {
        uVar4 = (uVar4 + (uint)pbVar6[3] * 0x200000) - 0x200000;
        if ((char)pbVar6[3] < '\0') {
          uVar4 = uVar4 + (uint)pbVar6[4] * 0x10000000 + 0xf0000000;
          if ((char)pbVar6[4] < '\0') {
            pbVar6 = pbVar6 + 6;
            iVar5 = 5;
            while ((char)pbVar6[-1] < '\0') {
              pbVar6 = pbVar6 + 1;
              iVar5 = iVar5 + -1;
              if (iVar5 == 0) {
                return -1;
              }
            }
          }
          else {
            pbVar6 = pbVar6 + 5;
          }
        }
        else {
          pbVar6 = pbVar6 + 4;
        }
      }
      else {
        pbVar6 = pbVar6 + 3;
      }
    }
    else {
      pbVar6 = pbVar6 + 2;
    }
    this->buffer_ = pbVar6;
    uVar3 = (ulong)uVar4;
  }
  return uVar3;
}

Assistant:

int64 CodedInputStream::ReadVarint32Fallback(uint32 first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32 temp;
    ::std::pair<bool, const uint8*> p =
          ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32 temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64>(temp) : -1;
  }
}